

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O1

void __thiscall
HighsLinearSumBounds::updatedImplVarLower
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient,
          double oldImplVarLower,HighsInt oldImplVarLowerSource)

{
  int *piVar1;
  double *pdVar2;
  pointer piVar3;
  pointer pHVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double oldImplVarLower_local;
  
  oldImplVarLower_local = oldImplVarLower;
  pdVar2 = this->varLower + var;
  if ((oldImplVarLowerSource != sum) && (*pdVar2 <= oldImplVarLower)) {
    pdVar2 = &oldImplVarLower_local;
  }
  dVar6 = *pdVar2;
  if (this->implVarLowerSource[var] == sum) {
    pdVar2 = this->varLower + var;
  }
  else {
    pdVar2 = this->implVarLower + var;
    dVar5 = this->varLower[var];
    if (*pdVar2 <= dVar5 && dVar5 != *pdVar2) {
      pdVar2 = this->varLower + var;
    }
  }
  dVar5 = *pdVar2;
  if ((dVar5 == dVar6) && (!NAN(dVar5) && !NAN(dVar6))) {
    return;
  }
  if (coefficient <= 0.0) {
    if (-INFINITY < dVar6) {
      dVar6 = dVar6 * coefficient;
      pHVar4 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = pHVar4[sum].hi;
      dVar8 = dVar7 - dVar6;
      pHVar4[sum].hi = dVar8;
      pHVar4[sum].lo =
           (dVar7 - (dVar6 + dVar8)) + (-dVar6 - (dVar8 - (dVar6 + dVar8))) + pHVar4[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    if (-INFINITY < dVar5) {
      pHVar4 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      goto LAB_0037dfed;
    }
    piVar3 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    if (-INFINITY < dVar6) {
      dVar6 = dVar6 * coefficient;
      pHVar4 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = pHVar4[sum].hi;
      dVar8 = dVar7 - dVar6;
      pHVar4[sum].hi = dVar8;
      pHVar4[sum].lo =
           (dVar7 - (dVar6 + dVar8)) + (-dVar6 - (dVar8 - (dVar6 + dVar8))) + pHVar4[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    if (-INFINITY < dVar5) {
      pHVar4 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
LAB_0037dfed:
      dVar5 = dVar5 * coefficient;
      dVar6 = pHVar4[sum].hi;
      dVar7 = dVar5 + dVar6;
      pHVar4[sum].hi = dVar7;
      pHVar4[sum].lo =
           (dVar6 - (dVar7 - dVar5)) + (dVar5 - (dVar7 - (dVar7 - dVar5))) + pHVar4[sum].lo;
      return;
    }
    piVar3 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  piVar3[sum] = piVar3[sum] + 1;
  return;
}

Assistant:

void HighsLinearSumBounds::updatedImplVarLower(HighsInt sum, HighsInt var,
                                               double coefficient,
                                               double oldImplVarLower,
                                               HighsInt oldImplVarLowerSource) {
  double oldVLower = oldImplVarLowerSource == sum
                         ? varLower[var]
                         : std::max(oldImplVarLower, varLower[var]);

  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);

  if (vLower == oldVLower) return;

  if (coefficient > 0) {
    if (oldVLower == -kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= oldVLower * coefficient;

    if (vLower == -kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vLower * coefficient;

  } else {
    if (oldVLower == -kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= oldVLower * coefficient;

    if (vLower == -kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vLower * coefficient;
  }
}